

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O3

void __thiscall
ElementsAddressFactory_CreatePegOutAddress_Test::~ElementsAddressFactory_CreatePegOutAddress_Test
          (ElementsAddressFactory_CreatePegOutAddress_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreatePegOutAddress)
{
  Descriptor desc;
  auto pegout_addr = ElementsAddressFactory::CreatePegOutAddress(
    NetType::kRegtest, NetType::kElementsRegtest,
    "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))", 0, AddressType::kP2shP2wpkhAddress, &desc);
  EXPECT_EQ(pegout_addr.GetAddress(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  EXPECT_EQ(desc.ToString(false), "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))");

  pegout_addr = ElementsAddressFactory::CreatePegOutAddress(
    NetType::kRegtest, NetType::kElementsRegtest,
    "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))", 0, AddressType::kP2shP2wpkhAddress, &desc);
  EXPECT_EQ(pegout_addr.GetAddress(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  EXPECT_EQ(desc.ToString(false), "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))");

  pegout_addr = ElementsAddressFactory::CreatePegOutAddress(
    NetType::kRegtest, NetType::kElementsRegtest,
    "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y", 0, AddressType::kP2shP2wpkhAddress, &desc);
  EXPECT_EQ(pegout_addr.GetAddress(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  EXPECT_EQ(desc.ToString(false), "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))");

  pegout_addr = ElementsAddressFactory::CreatePegOutAddress(
    NetType::kRegtest, NetType::kElementsRegtest,
    "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y", 0, AddressType::kP2wpkhAddress, &desc);
  EXPECT_EQ(pegout_addr.GetAddress(), "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf");
  EXPECT_EQ(desc.ToString(false), "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)");

  pegout_addr = ElementsAddressFactory::CreatePegOutAddress(
    NetType::kRegtest, NetType::kElementsRegtest,
    "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y", 0, AddressType::kP2pkhAddress, &desc);
  EXPECT_EQ(pegout_addr.GetAddress(), "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw");
  EXPECT_EQ(desc.ToString(false), "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)");
}